

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

void NscPushElementAccess(CNscPStackEntry *pOut,CNscPStackEntry *pStruct,NscType nType,int nElement)

{
  uint *puVar1;
  size_t *pauchData;
  size_t nDataSize;
  uchar *puVar2;
  NscPCodeVariable *pv;
  
  pauchData = (size_t *)pStruct->m_pauchData;
  nDataSize = pStruct->m_nDataSize;
  if ((((nDataSize == 0) || (*pauchData != nDataSize)) || ((int)pauchData[1] != 0)) ||
     ((pauchData[5] & 0xbc) != 0)) {
    CNscPStackEntry::PushElement(pOut,nType,pStruct->m_nType,nElement,(uchar *)pauchData,nDataSize);
  }
  else {
    CNscPStackEntry::PushVariable
              (pOut,nType,*(NscType *)((long)pauchData + 0xc),pauchData[3],nElement,
               *(int *)((long)pauchData + 0x24),(UINT32)pauchData[5]);
    puVar2 = (g_pCtx->m_sSymbols).m_pauchData;
    if (puVar2 == (uchar *)0x0) {
      __assert_fail("pSymbol",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                    ,0x16d,
                    "void NscPushElementAccess(CNscPStackEntry *, CNscPStackEntry *, NscType, int)")
      ;
    }
    puVar1 = (uint *)(puVar2 + pauchData[3] + 0x24);
    *puVar1 = *puVar1 | 0x4000000;
  }
  if (pOut->m_nType == NscType_Unknown) {
    pOut->m_nType = nType;
    if (0x1f < (int)nType) {
      CNscContext::GenerateMessage(g_pCtx,NscMessage_WarningNestedStructAccess);
      return;
    }
    return;
  }
  __assert_fail("m_nType == NscType_Unknown",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0xee,"void CNscPStackEntry::SetType(NscType)");
}

Assistant:

void NscPushElementAccess (CNscPStackEntry *pOut, 
	CNscPStackEntry *pStruct, NscType nType, int nElement)
{

	//
	// If this is a simple variable
	//

	if (pStruct ->IsSimpleVariable ())
	{
		NscPCodeVariable *pv = (NscPCodeVariable *) pStruct ->GetData ();
		pOut ->PushVariable (nType, pv ->nType, pv ->nSymbol, nElement, 
			pv ->nStackOffset, pv ->ulFlags);

		NscSymbol *pSymbol = g_pCtx ->GetSymbol (pv ->nSymbol);
		assert (pSymbol);

		NscParserReferenceSymbol (pSymbol);
	}

	//
	// Otherwise, we need to do an element access
	//

	else
	{
		pOut ->PushElement (nType, pStruct ->GetType (), nElement,
			pStruct ->GetData (), pStruct ->GetDataSize ());
	}

	//
	// Set the return type
	//

	pOut ->SetType (nType);

	//
	// If we are accessing an element that is also a structure, emit a warning
	// as this does not work correctly with the standard compiler
	//

	if (nType >= NscType_Struct_0)
	{
		g_pCtx ->GenerateMessage (NscMessage_WarningNestedStructAccess);
	}
}